

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void addLinkLibrary(cmMakefile *mf,string *target,string *lib,cmTargetLinkLibraryType llt)

{
  bool bVar1;
  cmTarget *this;
  cmGlobalGenerator *this_00;
  cmTarget *this_01;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  this = cmMakefile::FindLocalNonAliasTarget(mf,target);
  if (this == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Attempt to add link library \"",0x1d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" to target \"",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(target->_M_dataplus)._M_p,target->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"\" which is not built in this directory.",0x27);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  else {
    this_00 = cmMakefile::GetGlobalGenerator(mf);
    this_01 = cmGlobalGenerator::FindTarget(this_00,lib,false);
    if ((this_01 != (cmTarget *)0x0) &&
       ((INTERFACE_LIBRARY < this_01->TargetTypeValue ||
        ((0x86U >> (this_01->TargetTypeValue & 0x1f) & 1) == 0)))) {
      bVar1 = cmTarget::IsExecutableWithExports(this_01);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" of type ",10);
        __s = cmState::GetTargetTypeName(this_01->TargetTypeValue);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," may not be linked into another target.  ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"One may link only to STATIC or SHARED libraries, or ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"to executables with the ENABLE_EXPORTS property set.",0x34);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
    }
    cmTarget::AddLinkLibrary(this,mf,lib,llt);
  }
  return;
}

Assistant:

static void addLinkLibrary(cmMakefile* mf, std::string const& target,
                           std::string const& lib, cmTargetLinkLibraryType llt)
{
  cmTarget* t = mf->FindLocalNonAliasTarget(target);
  if (!t) {
    std::ostringstream e;
    e << "Attempt to add link library \"" << lib << "\" to target \"" << target
      << "\" which is not built in this directory.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  cmTarget* tgt = mf->GetGlobalGenerator()->FindTarget(lib);
  if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
      (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
      (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
      !tgt->IsExecutableWithExports()) {
    std::ostringstream e;
    e << "Target \"" << lib << "\" of type "
      << cmState::GetTargetTypeName(tgt->GetType())
      << " may not be linked into another target.  "
      << "One may link only to STATIC or SHARED libraries, or "
      << "to executables with the ENABLE_EXPORTS property set.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
  }

  t->AddLinkLibrary(*mf, lib, llt);
}